

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltexture.cpp
# Opt level: O0

void __thiscall
QOpenGLTexture::setComparisonFunction(QOpenGLTexture *this,ComparisonFunction function)

{
  long lVar1;
  bool bVar2;
  QOpenGLTexturePrivate *this_00;
  ComparisonFunction in_ESI;
  QOpenGLTexturePrivate *in_RDI;
  long in_FS_OFFSET;
  QOpenGLTexturePrivate *d;
  undefined4 in_stack_ffffffffffffffb8;
  Feature in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc8;
  GLenum in_stack_ffffffffffffffd8;
  GLuint in_stack_ffffffffffffffdc;
  QOpenGLTextureHelper *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QOpenGLTexture *)0x18f6a9);
  QOpenGLTexturePrivate::create(in_RDI);
  bVar2 = QFlags<QOpenGLTexture::Feature>::testFlag
                    ((QFlags<QOpenGLTexture::Feature> *)this_00,in_stack_ffffffffffffffbc);
  if (bVar2) {
    this_00->comparisonFunction = in_ESI;
    QOpenGLTextureHelper::glTextureParameteri
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,
               (GLenum)((ulong)in_RDI >> 0x20),(GLenum)in_RDI,in_ESI);
  }
  else {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_RDI,(char *)CONCAT44(in_ESI,in_stack_ffffffffffffffc8),
               (int)((ulong)this_00 >> 0x20),
               (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    QMessageLogger::warning
              (&stack0xffffffffffffffd8,
               "QOpenGLTexture::setComparisonFunction: requires OpenGL >= 1.5 or OpenGL ES >= 3.0");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QOpenGLTexture::setComparisonFunction(QOpenGLTexture::ComparisonFunction function)
{
    Q_D(QOpenGLTexture);
    d->create();
    if (!d->features.testFlag(TextureComparisonOperators)) {
        qWarning("QOpenGLTexture::setComparisonFunction: requires OpenGL >= 1.5 or OpenGL ES >= 3.0");
        return;
    }
    d->comparisonFunction = function;
    d->texFuncs->glTextureParameteri(d->textureId, d->target, d->bindingTarget, GL_TEXTURE_COMPARE_FUNC, function);
}